

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O3

void __thiscall NAPComm::finalize(NAPComm *this)

{
  comm_pkg *pcVar1;
  comm_pkg *pcVar2;
  comm_pkg *pcVar3;
  comm_pkg *pcVar4;
  int iVar5;
  int iVar6;
  MPI_Request *ppoVar7;
  ulong uVar8;
  
  pcVar1 = this->local_L_comm;
  iVar5 = pcVar1->send_data->size_msgs;
  pcVar2 = this->local_S_comm;
  iVar6 = pcVar2->send_data->size_msgs;
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  pcVar3 = this->local_R_comm;
  this->buffer_size = iVar5;
  iVar6 = pcVar3->send_data->size_msgs;
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  this->buffer_size = iVar5;
  pcVar4 = this->global_comm;
  iVar6 = pcVar4->send_data->size_msgs;
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  this->buffer_size = iVar5;
  iVar6 = pcVar4->send_data->num_msgs + pcVar1->send_data->num_msgs;
  iVar5 = pcVar2->send_data->num_msgs;
  if (iVar6 < iVar5) {
    iVar6 = iVar5;
  }
  iVar5 = pcVar3->send_data->num_msgs;
  if (iVar6 < iVar5) {
    iVar6 = iVar5;
  }
  if (iVar6 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar8 = (long)iVar6 << 3;
    }
    ppoVar7 = (MPI_Request *)operator_new__(uVar8);
    this->send_requests = ppoVar7;
  }
  iVar6 = pcVar4->recv_data->num_msgs + pcVar1->recv_data->num_msgs;
  iVar5 = pcVar2->recv_data->num_msgs;
  if (iVar6 < iVar5) {
    iVar6 = iVar5;
  }
  iVar5 = pcVar3->recv_data->num_msgs;
  if (iVar6 < iVar5) {
    iVar6 = iVar5;
  }
  if (iVar6 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar8 = (long)iVar6 << 3;
    }
    ppoVar7 = (MPI_Request *)operator_new__(uVar8);
    this->recv_requests = ppoVar7;
  }
  return;
}

Assistant:

void finalize()
    {
        int tmp, max_n;

        // Find max size sent (for send_buffer)
        buffer_size = local_L_comm->send_data->size_msgs;
        tmp = local_S_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;
        tmp = local_R_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;
        tmp = global_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;

        // Find max number sent and recd
        max_n = local_L_comm->send_data->num_msgs + 
            global_comm->send_data->num_msgs;
        tmp = local_S_comm->send_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        tmp = local_R_comm->send_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        if (max_n) send_requests = new MPI_Request[max_n];

        // Find max number sent and recd
        max_n = local_L_comm->recv_data->num_msgs + 
            global_comm->recv_data->num_msgs;
        tmp = local_S_comm->recv_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        tmp = local_R_comm->recv_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        if (max_n) recv_requests = new MPI_Request[max_n];
    }